

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

void Bmc_CexCarePropagateFwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int nCapMin;
  int iVar5;
  int iVar6;
  
  uVar1 = Abc_Var2Lit((pCex->iFrame + 1) * pCex->nPis,0);
  p->pObjs->Value = uVar1;
  for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = uVar1;
  }
  vPriosFf->nSize = 0;
  iVar5 = 0;
  do {
    if (pCex->iFrame < iVar5) {
      return;
    }
    for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
      pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = pGVar3->Value;
      pGVar4->Value = uVar1;
      iVar2 = vPriosFf->nSize;
      if (iVar2 == vPriosFf->nCap) {
        nCapMin = iVar2 * 2;
        if (iVar2 < 0x10) {
          nCapMin = 0x10;
        }
        Vec_IntGrow(vPriosFf,nCapMin);
        iVar2 = vPriosFf->nSize;
      }
      vPriosFf->nSize = iVar2 + 1;
      vPriosFf->pArray[iVar2] = uVar1;
    }
    Bmc_CexCarePropagateFwdOne(p,pCex,iVar5,vPriosIn);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Bmc_CexCarePropagateFwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Gia_Obj_t * pObjRo, * pObjRi;
    int i, f, ValueMax = Abc_Var2Lit( pCex->nPis * (pCex->iFrame + 1), 0 );
    Gia_ManConst0( p )->Value = ValueMax;
    Gia_ManForEachRi( p, pObjRi, i )
        pObjRi->Value = ValueMax;
    Vec_IntClear( vPriosFf );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Vec_IntPush( vPriosFf, (pObjRo->Value = pObjRi->Value) );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
    }
}